

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLError __thiscall tinyxml2::XMLDocument::Parse(XMLDocument *this,char *p,size_t len)

{
  bool bVar1;
  char *pcVar2;
  XMLDocument *in_RDX;
  char *in_RSI;
  XMLDocument *in_RDI;
  XMLDocument *this_00;
  XMLError local_4;
  
  this_00 = in_RDI;
  Clear(in_RDX);
  if (((in_RDX == (XMLDocument *)0x0) || (in_RSI == (char *)0x0)) || (*in_RSI == '\0')) {
    SetError(in_RDI,XML_ERROR_EMPTY_DOCUMENT,(char *)0x0,(char *)0x0);
    local_4 = in_RDI->_errorID;
  }
  else {
    if (in_RDX == (XMLDocument *)0xffffffffffffffff) {
      in_RDX = (XMLDocument *)strlen(in_RSI);
    }
    pcVar2 = (char *)operator_new__((ulong)((long)&(in_RDX->super_XMLNode)._vptr_XMLNode + 1));
    in_RDI->_charBuffer = pcVar2;
    memcpy(in_RDI->_charBuffer,in_RSI,(size_t)in_RDX);
    in_RDI->_charBuffer[(long)in_RDX] = '\0';
    Parse(in_RDX);
    bVar1 = Error(in_RDI);
    if (bVar1) {
      XMLNode::DeleteChildren(&in_RDX->super_XMLNode);
      MemPoolT<104>::Clear((MemPoolT<104> *)this_00);
      MemPoolT<72>::Clear((MemPoolT<72> *)this_00);
      MemPoolT<96>::Clear((MemPoolT<96> *)this_00);
      MemPoolT<88>::Clear((MemPoolT<88> *)this_00);
    }
    local_4 = in_RDI->_errorID;
  }
  return local_4;
}

Assistant:

XMLError XMLDocument::Parse( const char* p, size_t len )
{
    Clear();

    if ( len == 0 || !p || !*p ) {
        SetError( XML_ERROR_EMPTY_DOCUMENT, 0, 0 );
        return _errorID;
    }
    if ( len == (size_t)(-1) ) {
        len = strlen( p );
    }
    _charBuffer = new char[ len+1 ];
    memcpy( _charBuffer, p, len );
    _charBuffer[len] = 0;

    Parse();
    if ( Error() ) {
        // clean up now essentially dangling memory.
        // and the parse fail can put objects in the
        // pools that are dead and inaccessible.
        DeleteChildren();
        _elementPool.Clear();
        _attributePool.Clear();
        _textPool.Clear();
        _commentPool.Clear();
    }
    return _errorID;
}